

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void UpdateModel(CPpmd7 *p)

{
  Byte BVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  Byte *pBVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  short *psVar10;
  CTX_PTR_conflict pCVar11;
  UInt32 *pUVar12;
  undefined4 *puVar13;
  CPpmd_State *p_00;
  CPpmd_State *s_4;
  CPpmd_State *s_3;
  UInt32 *pUStack_78;
  UInt32 n;
  UInt32 *s_2;
  UInt32 *d;
  void *oldPtr;
  void *ptr;
  uint i;
  uint oldNU;
  UInt32 sf;
  UInt32 cf;
  uint ns1;
  CTX_PTR_conflict cs;
  CPpmd_State *s_1;
  CPpmd_State *s;
  uint ns;
  uint s0;
  CTX_PTR_conflict c;
  CPpmd_Void_Ref fSuccessor;
  CPpmd_Void_Ref successor;
  CPpmd7 *p_local;
  
  c._0_4_ = CONCAT22(p->FoundState->SuccessorHigh,p->FoundState->SuccessorLow);
  if ((p->FoundState->Freq < 0x1f) && (p->MinContext->Suffix != 0)) {
    psVar10 = (short *)(p->Base + p->MinContext->Suffix);
    if (*psVar10 == 1) {
      if (*(byte *)((long)psVar10 + 3) < 0x20) {
        *(char *)((long)psVar10 + 3) = *(char *)((long)psVar10 + 3) + '\x01';
      }
    }
    else {
      pCVar11 = (CTX_PTR_conflict)(p->Base + *(uint *)(psVar10 + 2));
      if ((Byte)pCVar11->NumStats != p->FoundState->Symbol) {
        do {
          cs = pCVar11;
          pCVar11 = (CTX_PTR_conflict)((long)&cs->Stats + 2);
        } while ((Byte)pCVar11->NumStats != p->FoundState->Symbol);
        if (*(byte *)((long)&cs->NumStats + 1) <= *(byte *)((long)&cs->Stats + 3)) {
          SwapStates((CPpmd_State *)pCVar11,(CPpmd_State *)cs);
          pCVar11 = cs;
        }
      }
      cs = pCVar11;
      if (*(byte *)((long)&cs->NumStats + 1) < 0x73) {
        *(char *)((long)&cs->NumStats + 1) = *(char *)((long)&cs->NumStats + 1) + '\x02';
        psVar10[1] = psVar10[1] + 2;
      }
    }
  }
  if (p->OrderFall == 0) {
    pCVar11 = CreateSuccessors(p,1);
    p->MaxContext = pCVar11;
    p->MinContext = pCVar11;
    if (p->MinContext == (CPpmd7_Context *)0x0) {
      RestartModel(p);
    }
    else {
      SetSuccessor(p->FoundState,(int)p->MinContext - (int)p->Base);
    }
  }
  else {
    BVar1 = p->FoundState->Symbol;
    pBVar5 = p->Text;
    p->Text = pBVar5 + 1;
    *pBVar5 = BVar1;
    c._4_4_ = (int)p->Text - (int)p->Base;
    if (p->Text < p->UnitsStart) {
      if ((uint)c == 0) {
        SetSuccessor(p->FoundState,c._4_4_);
        c._0_4_ = (int)p->MinContext - (int)p->Base;
      }
      else {
        if ((uint)c <= c._4_4_) {
          pCVar11 = CreateSuccessors(p,0);
          if (pCVar11 == (CTX_PTR_conflict)0x0) {
            RestartModel(p);
            return;
          }
          c._0_4_ = (int)pCVar11 - (int)p->Base;
        }
        uVar6 = p->OrderFall - 1;
        p->OrderFall = uVar6;
        if (uVar6 == 0) {
          c._4_4_ = (uint)c;
          p->Text = p->Text + -(long)(int)(uint)(p->MaxContext != p->MinContext);
        }
      }
      uVar3 = p->MinContext->SummFreq;
      uVar6 = (uint)p->MinContext->NumStats;
      bVar2 = p->FoundState->Freq;
      for (_ns = p->MaxContext; _ns != p->MinContext;
          _ns = (CPpmd7_Context *)(p->Base + _ns->Suffix)) {
        uVar4 = _ns->NumStats;
        uVar7 = (uint)uVar4;
        if (uVar7 == 1) {
          puVar13 = (undefined4 *)AllocUnits(p,0);
          if (puVar13 == (undefined4 *)0x0) {
            RestartModel(p);
            return;
          }
          *puVar13 = *(undefined4 *)&_ns->SummFreq;
          *(undefined2 *)(puVar13 + 1) = *(undefined2 *)((long)&_ns->Stats + 2);
          _ns->Stats = (int)puVar13 - (int)p->Base;
          if (*(byte *)((long)puVar13 + 1) < 0x1e) {
            *(char *)((long)puVar13 + 1) = *(char *)((long)puVar13 + 1) << 1;
          }
          else {
            *(undefined1 *)((long)puVar13 + 1) = 0x78;
          }
          _ns->SummFreq =
               (ushort)*(byte *)((long)puVar13 + 1) + (short)p->InitEsc + (ushort)(3 < uVar6);
        }
        else {
          if ((uVar4 & 1) == 0) {
            s_3._4_4_ = (uint)(uVar4 >> 1);
            uVar8 = (uint)p->Units2Indx[s_3._4_4_ - 1];
            if (uVar8 != p->Units2Indx[s_3._4_4_]) {
              pUVar12 = (UInt32 *)AllocUnits(p,uVar8 + 1);
              if (pUVar12 == (UInt32 *)0x0) {
                RestartModel(p);
                return;
              }
              pBVar5 = p->Base;
              uVar9 = _ns->Stats;
              pUStack_78 = (UInt32 *)(pBVar5 + uVar9);
              s_2 = pUVar12;
              do {
                *s_2 = *pUStack_78;
                s_2[1] = pUStack_78[1];
                s_2[2] = pUStack_78[2];
                pUStack_78 = pUStack_78 + 3;
                s_2 = s_2 + 3;
                s_3._4_4_ = s_3._4_4_ - 1;
              } while (s_3._4_4_ != 0);
              InsertNode(p,pBVar5 + uVar9,uVar8);
              _ns->Stats = (int)pUVar12 - (int)p->Base;
            }
          }
          _ns->SummFreq =
               _ns->SummFreq + (ushort)(uVar7 << 1 < uVar6) +
               (ushort)(uVar7 << 2 <= uVar6 && (uint)_ns->SummFreq <= uVar7 << 3) * 2;
        }
        uVar8 = (uint)p->FoundState->Freq * 2 * (_ns->SummFreq + 6);
        uVar9 = ((uVar3 - uVar6) - (bVar2 - 1)) + (uint)_ns->SummFreq;
        if (uVar8 < uVar9 * 6) {
          oldNU = (uVar9 < uVar8) + 1 + (uint)(uVar9 * 4 <= uVar8);
          _ns->SummFreq = _ns->SummFreq + 3;
        }
        else {
          oldNU = (uVar9 * 9 <= uVar8) + 4 + (uint)(uVar9 * 0xc <= uVar8) +
                  (uint)(uVar9 * 0xf <= uVar8);
          _ns->SummFreq = _ns->SummFreq + (short)oldNU;
        }
        p_00 = (CPpmd_State *)(p->Base + (ulong)uVar7 * 6 + (ulong)_ns->Stats);
        SetSuccessor(p_00,c._4_4_);
        p_00->Symbol = p->FoundState->Symbol;
        p_00->Freq = (Byte)oldNU;
        _ns->NumStats = uVar4 + 1;
      }
      p->MinContext = (CPpmd7_Context *)(p->Base + (uint)c);
      p->MaxContext = (CPpmd7_Context *)(p->Base + (uint)c);
    }
    else {
      RestartModel(p);
    }
  }
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}